

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropCommandBase.cxx
# Opt level: O0

bool __thiscall
cmTargetPropCommandBase::HandleArguments
          (cmTargetPropCommandBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,string *prop,ArgumentFlags flags)

{
  cmMakefile *pcVar1;
  bool bVar2;
  TargetType TVar3;
  size_type sVar4;
  const_reference pvVar5;
  cmake *this_00;
  cmGlobalGenerator *this_01;
  cmTarget *pcVar6;
  ulong uVar7;
  bool local_1d9;
  allocator<char> local_1a1;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_129;
  string local_128;
  byte local_102;
  allocator<char> local_101;
  undefined1 local_100 [6];
  bool prepend;
  uint local_e0;
  byte local_da;
  allocator<char> local_d9;
  uint argIndex;
  bool system;
  allocator<char> local_b1;
  string local_b0;
  byte local_8b;
  bool local_8a;
  allocator<char> local_89;
  undefined1 local_88 [5];
  bool isCustomTarget;
  bool isRegularTarget;
  allocator<char> local_51;
  string local_50;
  ArgumentFlags local_2c;
  string *psStack_28;
  ArgumentFlags flags_local;
  string *prop_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmTargetPropCommandBase *this_local;
  
  local_2c = flags;
  psStack_28 = prop;
  prop_local = (string *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar4 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"called with incorrect number of arguments",&local_51);
    SetError(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    return false;
  }
  pcVar1 = this->Makefile;
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)prop_local,0);
  bVar2 = cmMakefile::IsAlias(pcVar1,pvVar5);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_88,"can not be used on an ALIAS target.",&local_89);
    SetError(this,(string *)local_88);
    std::__cxx11::string::~string((string *)local_88);
    std::allocator<char>::~allocator(&local_89);
    return false;
  }
  this_00 = cmMakefile::GetCMakeInstance(this->Makefile);
  this_01 = cmake::GetGlobalGenerator(this_00);
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)prop_local,0);
  pcVar6 = cmGlobalGenerator::FindTarget(this_01,pvVar5,false);
  this->Target = pcVar6;
  if (this->Target == (cmTarget *)0x0) {
    pcVar1 = this->Makefile;
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)prop_local,0);
    pcVar6 = cmMakefile::FindTargetToUse(pcVar1,pvVar5,false);
    this->Target = pcVar6;
  }
  if (this->Target == (cmTarget *)0x0) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)prop_local,0);
    (*this->_vptr_cmTargetPropCommandBase[4])(this,pvVar5);
    return false;
  }
  TVar3 = cmTarget::GetType(this->Target);
  local_1d9 = true;
  if (TVar3 != EXECUTABLE) {
    TVar3 = cmTarget::GetType(this->Target);
    local_1d9 = true;
    if (TVar3 != STATIC_LIBRARY) {
      TVar3 = cmTarget::GetType(this->Target);
      local_1d9 = true;
      if (TVar3 != SHARED_LIBRARY) {
        TVar3 = cmTarget::GetType(this->Target);
        local_1d9 = true;
        if (TVar3 != MODULE_LIBRARY) {
          TVar3 = cmTarget::GetType(this->Target);
          local_1d9 = true;
          if (TVar3 != OBJECT_LIBRARY) {
            TVar3 = cmTarget::GetType(this->Target);
            local_1d9 = true;
            if (TVar3 != INTERFACE_LIBRARY) {
              TVar3 = cmTarget::GetType(this->Target);
              local_1d9 = TVar3 == UNKNOWN_LIBRARY;
            }
          }
        }
      }
    }
  }
  local_8a = local_1d9;
  TVar3 = cmTarget::GetType(this->Target);
  local_8b = TVar3 == UTILITY;
  bVar2 = std::operator==(psStack_28,"SOURCES");
  if (bVar2) {
    if (((local_8a & 1U) == 0) && ((local_8b & 1) == 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"called with non-compilable target type",&local_b1);
      SetError(this,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator(&local_b1);
      return false;
    }
  }
  else if ((local_8a & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&argIndex,"called with non-compilable target type",&local_d9);
    SetError(this,(string *)&argIndex);
    std::__cxx11::string::~string((string *)&argIndex);
    std::allocator<char>::~allocator(&local_d9);
    return false;
  }
  local_da = 0;
  local_e0 = 1;
  if ((local_2c & PROCESS_SYSTEM) != NO_FLAGS) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)prop_local,1);
    bVar2 = std::operator==(pvVar5,"SYSTEM");
    if (bVar2) {
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)prop_local);
      if (sVar4 < 3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_100,"called with incorrect number of arguments",&local_101);
        SetError(this,(string *)local_100);
        std::__cxx11::string::~string((string *)local_100);
        std::allocator<char>::~allocator(&local_101);
        return false;
      }
      local_da = 1;
      local_e0 = local_e0 + 1;
    }
  }
  local_102 = 0;
  if ((local_2c & PROCESS_BEFORE) != NO_FLAGS) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)prop_local,(ulong)local_e0);
    bVar2 = std::operator==(pvVar5,"BEFORE");
    if (bVar2) {
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)prop_local);
      if (sVar4 < 3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_128,"called with incorrect number of arguments",&local_129);
        SetError(this,&local_128);
        std::__cxx11::string::~string((string *)&local_128);
        std::allocator<char>::~allocator(&local_129);
        return false;
      }
      local_102 = 1;
      local_e0 = local_e0 + 1;
      goto LAB_006950fa;
    }
  }
  if ((local_2c & PROCESS_AFTER) != NO_FLAGS) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)prop_local,(ulong)local_e0);
    bVar2 = std::operator==(pvVar5,"AFTER");
    if (bVar2) {
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)prop_local);
      if (sVar4 < 3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_150,"called with incorrect number of arguments",&local_151);
        SetError(this,&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        std::allocator<char>::~allocator(&local_151);
        return false;
      }
      local_102 = 0;
      local_e0 = local_e0 + 1;
    }
  }
LAB_006950fa:
  if ((local_2c & PROCESS_REUSE_FROM) != NO_FLAGS) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)prop_local,(ulong)local_e0);
    bVar2 = std::operator==(pvVar5,"REUSE_FROM");
    if (bVar2) {
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)prop_local);
      if (sVar4 != 3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_178,"called with incorrect number of arguments",&local_179);
        SetError(this,&local_178);
        std::__cxx11::string::~string((string *)&local_178);
        std::allocator<char>::~allocator(&local_179);
        return false;
      }
      local_e0 = local_e0 + 1;
      pcVar6 = this->Target;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a0,"PRECOMPILE_HEADERS_REUSE_FROM",&local_1a1);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)prop_local,(ulong)local_e0);
      cmTarget::SetProperty(pcVar6,&local_1a0,pvVar5);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::allocator<char>::~allocator(&local_1a1);
      local_e0 = local_e0 + 1;
    }
  }
  std::__cxx11::string::operator=((string *)&this->Property,(string *)psStack_28);
  do {
    uVar7 = (ulong)local_e0;
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)prop_local);
    if (sVar4 <= uVar7) {
      return true;
    }
    bVar2 = ProcessContentArgs(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)prop_local,&local_e0,(bool)(local_102 & 1),
                               (bool)(local_da & 1));
  } while (bVar2);
  return false;
}

Assistant:

bool cmTargetPropCommandBase::HandleArguments(
  std::vector<std::string> const& args, const std::string& prop,
  ArgumentFlags flags)
{
  if (args.size() < 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  if (this->Makefile->IsAlias(args[0])) {
    this->SetError("can not be used on an ALIAS target.");
    return false;
  }
  // Lookup the target for which property-values are specified.
  this->Target =
    this->Makefile->GetCMakeInstance()->GetGlobalGenerator()->FindTarget(
      args[0]);
  if (!this->Target) {
    this->Target = this->Makefile->FindTargetToUse(args[0]);
  }
  if (!this->Target) {
    this->HandleMissingTarget(args[0]);
    return false;
  }
  const bool isRegularTarget =
    (this->Target->GetType() == cmStateEnums::EXECUTABLE) ||
    (this->Target->GetType() == cmStateEnums::STATIC_LIBRARY) ||
    (this->Target->GetType() == cmStateEnums::SHARED_LIBRARY) ||
    (this->Target->GetType() == cmStateEnums::MODULE_LIBRARY) ||
    (this->Target->GetType() == cmStateEnums::OBJECT_LIBRARY) ||
    (this->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY) ||
    (this->Target->GetType() == cmStateEnums::UNKNOWN_LIBRARY);
  const bool isCustomTarget = this->Target->GetType() == cmStateEnums::UTILITY;

  if (prop == "SOURCES") {
    if (!isRegularTarget && !isCustomTarget) {
      this->SetError("called with non-compilable target type");
      return false;
    }
  } else {
    if (!isRegularTarget) {
      this->SetError("called with non-compilable target type");
      return false;
    }
  }

  bool system = false;
  unsigned int argIndex = 1;

  if ((flags & PROCESS_SYSTEM) && args[argIndex] == "SYSTEM") {
    if (args.size() < 3) {
      this->SetError("called with incorrect number of arguments");
      return false;
    }
    system = true;
    ++argIndex;
  }

  bool prepend = false;
  if ((flags & PROCESS_BEFORE) && args[argIndex] == "BEFORE") {
    if (args.size() < 3) {
      this->SetError("called with incorrect number of arguments");
      return false;
    }
    prepend = true;
    ++argIndex;
  } else if ((flags & PROCESS_AFTER) && args[argIndex] == "AFTER") {
    if (args.size() < 3) {
      this->SetError("called with incorrect number of arguments");
      return false;
    }
    prepend = false;
    ++argIndex;
  }

  if ((flags & PROCESS_REUSE_FROM) && args[argIndex] == "REUSE_FROM") {
    if (args.size() != 3) {
      this->SetError("called with incorrect number of arguments");
      return false;
    }
    ++argIndex;

    this->Target->SetProperty("PRECOMPILE_HEADERS_REUSE_FROM", args[argIndex]);
    ++argIndex;
  }

  this->Property = prop;

  while (argIndex < args.size()) {
    if (!this->ProcessContentArgs(args, argIndex, prepend, system)) {
      return false;
    }
  }
  return true;
}